

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# auto-simplification.cpp
# Opt level: O1

void __thiscall simplifyRational_rational_Test::TestBody(simplifyRational_rational_Test *this)

{
  char *message;
  ExprPtr EVar1;
  AssertionResult gtest_ar;
  ExprPtr n2;
  ExprPtr f3o2;
  AssertHelper AStack_78;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_70;
  internal local_68 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_60;
  ExprPtr local_58;
  string local_48;
  ExprPtr local_28;
  
  local_58.super___shared_ptr<const_mathiu::impl::Expr,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  local_58.super___shared_ptr<const_mathiu::impl::Expr,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x50);
  (local_58.super___shared_ptr<const_mathiu::impl::Expr,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi)->_M_use_count = 1;
  (local_58.super___shared_ptr<const_mathiu::impl::Expr,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi)->_M_weak_count = 1;
  (local_58.super___shared_ptr<const_mathiu::impl::Expr,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi)->_vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_ptr_inplace_00253718;
  local_58.super___shared_ptr<const_mathiu::impl::Expr,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)
       (local_58.super___shared_ptr<const_mathiu::impl::Expr,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi + 1);
  *(undefined4 *)
   &local_58.super___shared_ptr<const_mathiu::impl::Expr,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
    _M_pi[1]._vptr__Sp_counted_base = 2;
  *(undefined1 *)
   &local_58.super___shared_ptr<const_mathiu::impl::Expr,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
    _M_pi[4]._M_use_count = 0;
  local_28.super___shared_ptr<const_mathiu::impl::Expr,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  local_28.super___shared_ptr<const_mathiu::impl::Expr,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x50);
  (local_28.super___shared_ptr<const_mathiu::impl::Expr,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi)->_M_use_count = 1;
  (local_28.super___shared_ptr<const_mathiu::impl::Expr,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi)->_M_weak_count = 1;
  (local_28.super___shared_ptr<const_mathiu::impl::Expr,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi)->_vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_ptr_inplace_00253718;
  local_28.super___shared_ptr<const_mathiu::impl::Expr,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)
       (local_28.super___shared_ptr<const_mathiu::impl::Expr,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi + 1);
  local_28.super___shared_ptr<const_mathiu::impl::Expr,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi[1]._vptr__Sp_counted_base = (_func_int **)0x200000003;
  *(undefined1 *)
   &local_28.super___shared_ptr<const_mathiu::impl::Expr,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
    _M_pi[4]._M_use_count = 1;
  EVar1 = mathiu::impl::operator+((impl *)&AStack_78,&local_58,&local_28);
  mathiu::impl::toString_abi_cxx11_
            (&local_48,(impl *)&AStack_78,
             (ExprPtr *)
             EVar1.super___shared_ptr<const_mathiu::impl::Expr,_(__gnu_cxx::_Lock_policy)2>.
             _M_refcount._M_pi._M_pi);
  testing::internal::CmpHelperEQ<std::__cxx11::string,char[4]>
            (local_68,"toString(n2 + f3o2)","\"7/2\"",&local_48,(char (*) [4])"7/2");
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != &local_48.field_2) {
    operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
  }
  if (local_70 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_70);
  }
  if (local_68[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_48);
    if (local_60 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      message = "";
    }
    else {
      message = (local_60->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&AStack_78,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/BowenFu[P]mathiu/test/mathiu/auto-simplification.cpp"
               ,0x6a,message);
    testing::internal::AssertHelper::operator=(&AStack_78,(Message *)&local_48);
    testing::internal::AssertHelper::~AssertHelper(&AStack_78);
    if ((long *)local_48._M_dataplus._M_p != (long *)0x0) {
      (**(code **)(*(long *)local_48._M_dataplus._M_p + 8))();
    }
  }
  if (local_60 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_60,local_60);
  }
  if (local_28.super___shared_ptr<const_mathiu::impl::Expr,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_28.super___shared_ptr<const_mathiu::impl::Expr,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (local_58.super___shared_ptr<const_mathiu::impl::Expr,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_58.super___shared_ptr<const_mathiu::impl::Expr,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  return;
}

Assistant:

TEST(simplifyRational, rational)
{
    auto const n2 = 2_i;
    auto const f3o2 = fraction(3, 2);

    EXPECT_EQ(toString(n2 + f3o2), "7/2");
}